

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::rust::UnderscoreDelimitFullName_abi_cxx11_
          (string *__return_storage_ptr__,rust *this,Context *ctx,string_view full_name)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_40;
  string_view full_name_local;
  
  full_name_local._M_str = (char *)full_name._M_len;
  full_name_local._M_len = (size_t)ctx;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&full_name_local,(allocator<char> *)&local_40);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_40,(char (*) [2])0x41082e,(char (*) [2])0x3f33d2);
  absl::lts_20240722::StrReplaceAll(&local_40,1,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoreDelimitFullName(Context& ctx,
                                      absl::string_view full_name) {
  std::string result = std::string(full_name);
  absl::StrReplaceAll({{".", "_"}}, &result);
  return result;
}